

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_set.cc
# Opt level: O1

int X509_set1_notAfter(X509 *x,ASN1_TIME *tm)

{
  X509_VAL *pXVar1;
  uint uVar2;
  ASN1_STRING *pAVar3;
  
  uVar2 = 0;
  if ((x != (X509 *)0x0) && (pXVar1 = x->cert_info->validity, uVar2 = 0, pXVar1 != (X509_VAL *)0x0))
  {
    pAVar3 = (ASN1_STRING *)pXVar1->notAfter;
    if (pAVar3 != (ASN1_STRING *)tm) {
      pAVar3 = ASN1_STRING_dup((ASN1_STRING *)tm);
      if (pAVar3 == (ASN1_STRING *)0x0) {
        pAVar3 = (ASN1_STRING *)0x0;
      }
      else {
        ASN1_TIME_free((ASN1_TIME *)x->cert_info->validity->notAfter);
        x->cert_info->validity->notAfter = (ASN1_TIME *)pAVar3;
      }
    }
    uVar2 = (uint)(pAVar3 != (ASN1_STRING *)0x0);
  }
  return uVar2;
}

Assistant:

int X509_set1_notAfter(X509 *x, const ASN1_TIME *tm) {
  ASN1_TIME *in;

  if ((x == NULL) || (x->cert_info->validity == NULL)) {
    return 0;
  }
  in = x->cert_info->validity->notAfter;
  if (in != tm) {
    in = ASN1_STRING_dup(tm);
    if (in != NULL) {
      ASN1_TIME_free(x->cert_info->validity->notAfter);
      x->cert_info->validity->notAfter = in;
    }
  }
  return in != NULL;
}